

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O0

QSizeF * __thiscall
QGraphicsLayoutItemPrivate::effectiveSizeHints(QGraphicsLayoutItemPrivate *this,QSizeF *constraint)

{
  bool bVar1;
  bool bVar2;
  QGraphicsLayoutItem *pQVar3;
  qreal *pqVar4;
  qreal *pqVar5;
  qreal *pqVar6;
  qreal *pqVar7;
  QSizeF *in_RSI;
  QGraphicsLayoutItemPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar8;
  QSizeF *descentS;
  QSizeF *maxS;
  QSizeF *prefS;
  QSizeF *minS;
  int i;
  bool hasConstraint;
  QSizeF *sizeHintCache;
  QGraphicsLayoutItem *q;
  QSizeF *in_stack_fffffffffffffec8;
  QSizeF *in_stack_fffffffffffffed0;
  QSizeF *in_stack_fffffffffffffed8;
  QSizeF *this_00;
  QSizeF *in_stack_fffffffffffffee0;
  QSizeF *result;
  QSizeF *in_stack_fffffffffffffee8;
  QSizeF *this_01;
  int local_98;
  QSizeF *local_90;
  QSizeF *local_70;
  QSizeF local_58;
  qreal local_40;
  QSizeF local_38;
  QSizeF local_28;
  qreal local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  qVar8 = QSizeF::width(in_RSI);
  bVar1 = true;
  if (qVar8 < 0.0) {
    qVar8 = QSizeF::height(in_RSI);
    bVar1 = 0.0 <= qVar8;
  }
  if (bVar1) {
    if ((((byte)in_RDI->field_0xb0 >> 1 & 1) == 0) &&
       (bVar2 = ::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8), bVar2)) {
      local_70 = in_RDI->cachedSizeHintsWithConstraints;
      goto LAB_009b4460;
    }
    local_90 = in_RDI->cachedSizeHintsWithConstraints;
  }
  else {
    if ((in_RDI->field_0xb0 & 1) == 0) {
      local_70 = in_RDI->cachedSizeHints;
      goto LAB_009b4460;
    }
    local_90 = in_RDI->cachedSizeHints;
  }
  for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
    local_90[local_98].wd = in_RSI->wd;
    local_90[local_98].ht = in_RSI->ht;
    if (in_RDI->userSizeHints != (QSizeF *)0x0) {
      combineSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
  }
  this_00 = local_90 + 1;
  this_01 = local_90 + 2;
  pqVar4 = QSizeF::rwidth(local_90);
  pqVar5 = QSizeF::rwidth(this_00);
  pqVar6 = QSizeF::rwidth(this_01);
  pqVar7 = QSizeF::rwidth(local_90 + 3);
  normalizeHints(pqVar4,pqVar5,pqVar6,pqVar7);
  pqVar4 = QSizeF::rheight(local_90);
  pqVar5 = QSizeF::rheight(this_00);
  pqVar6 = QSizeF::rheight(this_01);
  pqVar7 = QSizeF::rheight(local_90 + 3);
  normalizeHints(pqVar4,pqVar5,pqVar6,pqVar7);
  qVar8 = QSizeF::width(this_01);
  if ((qVar8 < 0.0) || (qVar8 = QSizeF::height(this_01), qVar8 < 0.0)) {
    (*pQVar3->_vptr_QGraphicsLayoutItem[6])(pQVar3,2,this_01);
    local_10 = qVar8;
    combineSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  QSizeF::QSizeF(&local_28,16777215.0,16777215.0);
  combineSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  expandSize(this_01,in_stack_fffffffffffffee8);
  expandSize(this_01,in_stack_fffffffffffffee8);
  QSizeF::QSizeF(&local_38,16777215.0,16777215.0);
  boundSize(this_01,in_stack_fffffffffffffee8);
  qVar8 = QSizeF::width(local_90);
  if ((qVar8 < 0.0) || (qVar8 = QSizeF::height(local_90), qVar8 < 0.0)) {
    in_stack_fffffffffffffee8 = local_90;
    (*pQVar3->_vptr_QGraphicsLayoutItem[6])(pQVar3,0,local_90);
    local_40 = qVar8;
    combineSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  result = local_90;
  QSizeF::QSizeF(&local_58,0.0,0.0);
  expandSize(this_01,in_stack_fffffffffffffee8);
  boundSize(this_01,in_stack_fffffffffffffee8);
  boundSize(this_01,in_stack_fffffffffffffee8);
  qVar8 = QSizeF::width(this_00);
  if ((qVar8 < 0.0) || (qVar8 = QSizeF::height(this_00), qVar8 < 0.0)) {
    (*pQVar3->_vptr_QGraphicsLayoutItem[6])(pQVar3,1,this_00);
    combineSize(result,this_00);
  }
  expandSize(this_01,in_stack_fffffffffffffee8);
  boundSize(this_01,in_stack_fffffffffffffee8);
  if (bVar1) {
    (in_RDI->cachedConstraint).wd = in_RSI->wd;
    (in_RDI->cachedConstraint).ht = in_RSI->ht;
    in_RDI->field_0xb0 = in_RDI->field_0xb0 & 0xfd;
  }
  else {
    in_RDI->field_0xb0 = in_RDI->field_0xb0 & 0xfe;
  }
  local_70 = local_90;
LAB_009b4460:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_70;
}

Assistant:

QSizeF *QGraphicsLayoutItemPrivate::effectiveSizeHints(const QSizeF &constraint) const
{
    Q_Q(const QGraphicsLayoutItem);
    QSizeF *sizeHintCache;
    const bool hasConstraint = constraint.width() >= 0 || constraint.height() >= 0;
    if (hasConstraint) {
        if (!sizeHintWithConstraintCacheDirty && constraint == cachedConstraint)
            return cachedSizeHintsWithConstraints;
        sizeHintCache = cachedSizeHintsWithConstraints;
    } else {
        if (!sizeHintCacheDirty)
            return cachedSizeHints;
        sizeHintCache = cachedSizeHints;
    }

    for (int i = 0; i < Qt::NSizeHints; ++i) {
        sizeHintCache[i] = constraint;
        if (userSizeHints)
            combineSize(sizeHintCache[i], userSizeHints[i]);
    }

    QSizeF &minS = sizeHintCache[Qt::MinimumSize];
    QSizeF &prefS = sizeHintCache[Qt::PreferredSize];
    QSizeF &maxS = sizeHintCache[Qt::MaximumSize];
    QSizeF &descentS = sizeHintCache[Qt::MinimumDescent];

    normalizeHints(minS.rwidth(), prefS.rwidth(), maxS.rwidth(), descentS.rwidth());
    normalizeHints(minS.rheight(), prefS.rheight(), maxS.rheight(), descentS.rheight());

    // if the minimum, preferred and maximum sizes contradict each other
    // (e.g. the minimum is larger than the maximum) we give priority to
    // the maximum size, then the minimum size and finally the preferred size
    COMBINE_SIZE(maxS, q->sizeHint(Qt::MaximumSize, maxS));
    combineSize(maxS, QSizeF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX));
    expandSize(maxS, prefS);
    expandSize(maxS, minS);
    boundSize(maxS, QSizeF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX));

    COMBINE_SIZE(minS, q->sizeHint(Qt::MinimumSize, minS));
    expandSize(minS, QSizeF(0, 0));
    boundSize(minS, prefS);
    boundSize(minS, maxS);

    COMBINE_SIZE(prefS, q->sizeHint(Qt::PreferredSize, prefS));
    expandSize(prefS, minS);
    boundSize(prefS, maxS);

    // Not supported yet
    // COMBINE_SIZE(descentS, q->sizeHint(Qt::MinimumDescent, constraint));

    if (hasConstraint) {
        cachedConstraint = constraint;
        sizeHintWithConstraintCacheDirty = false;
    } else {
        sizeHintCacheDirty = false;
    }
    return sizeHintCache;
}